

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

PyObject * PyInit_pydatalisp(void)

{
  int iVar1;
  PyObject *pPVar2;
  
  if (PyInit_pydatalisp::moduledef == '\0') {
    iVar1 = __cxa_guard_acquire(&PyInit_pydatalisp::moduledef);
    if (iVar1 != 0) {
      PyInit_pydatalisp::moduledef.m_base.m_copy = (PyObject *)0x0;
      PyInit_pydatalisp::moduledef.m_base.m_init = (_func_PyObject_ptr *)0x0;
      PyInit_pydatalisp::moduledef.m_base.m_index = 0;
      PyInit_pydatalisp::moduledef.m_base.ob_base = PyInit_pydatalisp::initial_m_base.ob_base;
      PyInit_pydatalisp::moduledef.m_name = "pydatalisp";
      PyInit_pydatalisp::moduledef.m_doc = (char *)0x0;
      PyInit_pydatalisp::moduledef.m_size = -1;
      PyInit_pydatalisp::moduledef.m_methods = PyInit_pydatalisp::initial_methods;
      PyInit_pydatalisp::moduledef.m_slots = (PyModuleDef_Slot *)0x0;
      PyInit_pydatalisp::moduledef.m_traverse = (traverseproc)0x0;
      PyInit_pydatalisp::moduledef.m_clear = (inquiry)0x0;
      PyInit_pydatalisp::moduledef.m_free = (freefunc)0x0;
      __cxa_guard_release(&PyInit_pydatalisp::moduledef);
    }
  }
  pPVar2 = (PyObject *)
           boost::python::detail::init_module(&PyInit_pydatalisp::moduledef,init_module_pydatalisp);
  return pPVar2;
}

Assistant:

BOOST_PYTHON_MODULE(pydatalisp)
{
	bpy::def("version", version);

	//--
	bpy::class_<SourceLogger>("SourceLogger")
		.add_property("warningCount", &SourceLogger::warningCount)
		.add_property("errorCount", &SourceLogger::errorCount);

	//--// TODO: Add expressions!
	bpy::class_<DataLisp, boost::noncopyable>("DataLisp",
											  bpy::init<SourceLogger*>(bpy::args("source_logger")))
		.def("parse", (void (DataLisp::*)(const string_t&)) & DataLisp::parse)
		.def("build", &DataLisp::build)
		.def("generate", &DataLisp::generate)
		.staticmethod("generate")
		.def("dump", &DataLisp::dump);

	//--
	bpy::class_<DataContainer_PY>("DataContainer")
		.add_property("topGroups", &DataContainer_PY::getTopGroups_PY)
		.def("addTopGroup", &DataContainer_PY::addTopGroup_PY);

	//--
	bpy::class_<DataGroup_PY>("DataGroup",
							  bpy::init<bpy::optional<string_t>>(bpy::args("id")))
		.add_property("id", &DataGroup_PY::id, &DataGroup_PY::setID)
		.def("add", &DataGroup_PY::add_PY)
		.def("at", &DataGroup_PY::at_PY)
		.def("__getitem__", &DataGroup_PY::getSpecial_PY)
		.add_property("anonymousCount", &DataGroup_PY::anonymousCount)
		.add_property("isArray", &DataGroup_PY::isArray)
		.def("fromKey", &DataGroup_PY::getFromKey_PY)
		.def("allFromKey", &DataGroup_PY::getAllFromKey_PY)
		.def("hasKey", &DataGroup_PY::hasKey)
		.def("__contains__", &DataGroup_PY::hasSpecialKey_PY)
		.add_property("namedEntries", &DataGroup_PY::getNamedEntries_PY)
		.add_property("anonymousEntries", &DataGroup_PY::getAnonymousEntries_PY)
		.add_property("entries", &DataGroup_PY::getEntries_PY)
		.def("isAllAnonymousNumber", &DataGroup_PY::isAllNumber)
		.def("isAllNamedNumber", &DataGroup_PY::isAllNumber)
		.def("isAllNumber", &DataGroup_PY::isAllNumber);

	//--
	bpy::class_<Data_PY>("Data",
						 bpy::init<bpy::optional<string_t>>(bpy::args("key")))
		.add_property("key", &Data_PY::key, &Data::setKey)
		.add_property("type", &Data_PY::type)
		.add_property("group", &Data_PY::getGroup_PY, &Data_PY::setGroup)
		.add_property("int", &Data_PY::getInt, &Data_PY::setInt)
		.add_property("float", &Data_PY::getFloat, &Data_PY::setFloat)
		.add_property("number", &Data_PY::getNumber)
		.add_property("bool", &Data_PY::getBool, &Data_PY::setBool)
		.add_property("string", &Data_PY::getString, &Data_PY::setString)
		.def("__str__", &Data_PY::str_PY)
		.def("__bool__", &Data_PY::isValid)
		.def("isNumber", &Data_PY::isNumber);

	bpy::enum_<DataType>("DataType")
		.value("Group", DT_Group)
		.value("Integer", DT_Integer)
		.value("Float", DT_Float)
		.value("Bool", DT_Bool)
		.value("String", DT_String)
		.value("None", DT_None);
}